

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

bin_t * duckdb_je_arena_bin_choose(tsdn_t *tsdn,arena_t *arena,szind_t binind,uint *binshard_p)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if ((tsdn != (tsdn_t *)0x0) &&
     ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena != (arena_t *)0x0)) {
    uVar1 = (ulong)(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.
                   binshard[binind];
  }
  if (binshard_p != (uint *)0x0) {
    *binshard_p = (uint)uVar1;
  }
  uVar2 = (ulong)((uint)uVar1 << 8);
  if (binind < duckdb_je_bin_info_nbatched_sizes) {
    uVar2 = uVar1 * 0x288;
  }
  return (bin_t *)((long)&arena->nthreads[0].repr + uVar2 + duckdb_je_arena_bin_offsets[binind]);
}

Assistant:

bin_t *
arena_bin_choose(tsdn_t *tsdn, arena_t *arena, szind_t binind,
    unsigned *binshard_p) {
	unsigned binshard;
	if (tsdn_null(tsdn) || tsd_arena_get(tsdn_tsd(tsdn)) == NULL) {
		binshard = 0;
	} else {
		binshard = tsd_binshardsp_get(tsdn_tsd(tsdn))->binshard[binind];
	}
	assert(binshard < bin_infos[binind].n_shards);
	if (binshard_p != NULL) {
		*binshard_p = binshard;
	}
	return arena_get_bin(arena, binind, binshard);
}